

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O1

bool anon_unknown.dwarf_ab5591::VisitPreset<cmCMakePresetsGraph::BuildPreset>
               (BuildPreset *preset,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
               *presets,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                        *cycleStatus,cmCMakePresetsGraph *graph)

{
  string *__k;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this;
  key_type *pkVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  int iVar4;
  mapped_type *pmVar5;
  const_iterator cVar6;
  iterator iVar7;
  size_type sVar8;
  _Rb_tree_node_base *p_Var9;
  key_type *__k_00;
  _Link_type __x;
  key_type local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  local_60;
  
  __k = &(preset->super_Preset).Name;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
           ::operator[](cycleStatus,__k);
  bVar3 = true;
  if (*pmVar5 != Verified) {
    if (*pmVar5 == InProgress) {
      cmCMakePresetsErrors::CYCLIC_PRESET_INHERITANCE(__k,&graph->parseState);
    }
    else {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
               ::operator[](cycleStatus,__k);
      *pmVar5 = InProgress;
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
      this = &(preset->super_Preset).Environment;
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::find(&this->_M_t,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (((_Rb_tree_header *)cVar6._M_node ==
           &(preset->super_Preset).Environment._M_t._M_impl.super__Rb_tree_header) &&
         (iVar4 = (*(preset->super_Preset)._vptr_Preset[3])(preset), (char)iVar4 != '\0')) {
        __k_00 = (preset->super_Preset).Inherits.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pkVar1 = (preset->super_Preset).Inherits.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (__k_00 != pkVar1) {
          do {
            iVar7 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
                    ::find(&presets->_M_t,__k_00);
            if ((_Rb_tree_header *)iVar7._M_node == &(presets->_M_t)._M_impl.super__Rb_tree_header)
            goto LAB_002ef45e;
            sVar8 = std::
                    _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::count(&(((preset->super_Preset).OriginFile)->ReachableFiles)._M_h,
                            (key_type *)&iVar7._M_node[4]._M_parent);
            if (sVar8 == 0) {
              cmCMakePresetsErrors::INHERITED_PRESET_UNREACHABLE_FROM_FILE(__k,&graph->parseState);
              goto LAB_002ef463;
            }
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
            ::map(&local_60,cycleStatus);
            __x = (_Link_type)presets;
            bVar3 = VisitPreset<cmCMakePresetsGraph::BuildPreset>
                              ((BuildPreset *)(iVar7._M_node + 2),presets,&local_60,graph);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
            ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                        *)local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
            if (!bVar3) goto LAB_002ef463;
            iVar4 = (*(preset->super_Preset)._vptr_Preset[2])
                              (preset,(BuildPreset *)(iVar7._M_node + 2));
            if ((char)iVar4 == '\0') goto LAB_002ef45e;
            for (p_Var9 = *(_Rb_tree_node_base **)(iVar7._M_node + 8);
                p_Var9 != (_Rb_tree_node_base *)&iVar7._M_node[7]._M_left;
                p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
              ::
              _M_insert_unique<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>const&>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                          *)this,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)(p_Var9 + 1));
            }
            if ((preset->super_Preset).ConditionEvaluator.
                super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr == (element_type *)0x0) {
              (preset->super_Preset).ConditionEvaluator.
              super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)iVar7._M_node[6]._M_left;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&(preset->super_Preset).ConditionEvaluator.
                          super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount,
                         (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&iVar7._M_node[6]._M_right);
            }
            __k_00 = __k_00 + 1;
          } while (__k_00 != pkVar1);
        }
        peVar2 = (preset->super_Preset).ConditionEvaluator.
                 super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if ((peVar2 != (element_type *)0x0) &&
           (iVar4 = (*peVar2->_vptr_Condition[3])(), (char)iVar4 != '\0')) {
          this_00 = (preset->super_Preset).ConditionEvaluator.
                    super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          (preset->super_Preset).ConditionEvaluator.
          super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (preset->super_Preset).ConditionEvaluator.
          super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
        }
        iVar4 = (*(preset->super_Preset)._vptr_Preset[4])
                          (preset,(ulong)(uint)((preset->super_Preset).OriginFile)->Version,
                           &graph->parseState);
        if ((char)iVar4 != '\0') {
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                   ::operator[](cycleStatus,__k);
          *pmVar5 = Verified;
          return true;
        }
      }
LAB_002ef45e:
      cmCMakePresetsErrors::INVALID_PRESET_NAMED(__k,&graph->parseState);
    }
LAB_002ef463:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool VisitPreset(
  T& preset,
  std::map<std::string, cmCMakePresetsGraph::PresetPair<T>>& presets,
  std::map<std::string, CycleStatus> cycleStatus, cmCMakePresetsGraph& graph)
{
  switch (cycleStatus[preset.Name]) {
    case CycleStatus::InProgress:
      cmCMakePresetsErrors::CYCLIC_PRESET_INHERITANCE(preset.Name,
                                                      &graph.parseState);
      return false;
    case CycleStatus::Verified:
      return true;
    default:
      break;
  }

  cycleStatus[preset.Name] = CycleStatus::InProgress;

  if (preset.Environment.count("") != 0) {
    cmCMakePresetsErrors::INVALID_PRESET_NAMED(preset.Name, &graph.parseState);
    return false;
  }

  bool result = preset.VisitPresetBeforeInherit();
  if (!result) {
    cmCMakePresetsErrors::INVALID_PRESET_NAMED(preset.Name, &graph.parseState);
    return false;
  }

  for (auto const& i : preset.Inherits) {
    auto parent = presets.find(i);
    if (parent == presets.end()) {
      cmCMakePresetsErrors::INVALID_PRESET_NAMED(preset.Name,
                                                 &graph.parseState);
      return false;
    }

    auto& parentPreset = parent->second.Unexpanded;
    if (!preset.OriginFile->ReachableFiles.count(parentPreset.OriginFile)) {
      cmCMakePresetsErrors::INHERITED_PRESET_UNREACHABLE_FROM_FILE(
        preset.Name, &graph.parseState);
      return false;
    }

    if (!VisitPreset(parentPreset, presets, cycleStatus, graph)) {
      return false;
    }

    result = preset.VisitPresetInherit(parentPreset);
    if (!result) {
      cmCMakePresetsErrors::INVALID_PRESET_NAMED(preset.Name,
                                                 &graph.parseState);
      return false;
    }

    for (auto const& v : parentPreset.Environment) {
      preset.Environment.insert(v);
    }

    if (!preset.ConditionEvaluator) {
      preset.ConditionEvaluator = parentPreset.ConditionEvaluator;
    }
  }

  if (preset.ConditionEvaluator && preset.ConditionEvaluator->IsNull()) {
    preset.ConditionEvaluator.reset();
  }

  result = preset.VisitPresetAfterInherit(graph.GetVersion(preset),
                                          &graph.parseState);
  if (!result) {
    cmCMakePresetsErrors::INVALID_PRESET_NAMED(preset.Name, &graph.parseState);
    return false;
  }

  cycleStatus[preset.Name] = CycleStatus::Verified;
  return true;
}